

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play-full.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 *in_RSI;
  int in_EDI;
  int sampleSize_bytes;
  SDL_AudioDeviceID deviceIdOut;
  SDL_AudioSpec obtainedSpec;
  SDL_AudioSpec playbackSpec;
  int i;
  int nDevices;
  ifstream fin;
  int playbackId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  size_t *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  key_type *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  uint local_31c;
  char **in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcfc;
  uint local_300;
  ushort local_2fc;
  byte local_2fa;
  ushort local_2f8;
  undefined4 local_2e0;
  undefined2 local_2dc;
  undefined1 local_2da;
  undefined2 local_2d8;
  code *local_2d0;
  undefined1 *local_2c8;
  uint local_2bc;
  uint local_2b8;
  undefined4 local_2b4;
  undefined1 local_2b0 [525];
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [36];
  uint local_44;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s input.kbd [-pN]\n",*in_RSI);
  printf("    -pN - select playback device N\n");
  printf("\n");
  if (local_8 < 2) {
    local_4 = -0x7f;
  }
  else {
    parseCmdArguments_abi_cxx11_(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0);
    std::allocator<char>::allocator();
    local_a2 = 0;
    local_a3 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (char *)in_stack_fffffffffffffcb8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 in_stack_fffffffffffffcb8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      local_a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (char *)in_stack_fffffffffffffcb8,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      local_a3 = 1;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   in_stack_fffffffffffffcb8);
      local_31c = std::__cxx11::stoi((string *)
                                     CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                     in_stack_fffffffffffffc78,0);
    }
    else {
      local_31c = 0;
    }
    if ((local_a3 & 1) != 0) {
      std::__cxx11::string::~string(local_a0);
    }
    if ((local_a2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_a1);
    }
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    local_44 = local_31c;
    std::ifstream::ifstream(local_2b0,(char *)local_10[1],_S_bin);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      fprintf(_stderr,"Failed to open file \'%s\'\n",local_10[1]);
      local_4 = -1;
    }
    else {
      iVar3 = SDL_Init(0x10);
      if (iVar3 < 0) {
        uVar5 = SDL_GetError();
        SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar5);
        local_4 = -1;
      }
      else {
        local_2b8 = SDL_GetNumAudioDevices(0);
        printf("Found %d playback devices:\n",(ulong)local_2b8);
        for (local_2bc = 0; uVar1 = local_2bc, (int)local_2bc < (int)local_2b8;
            local_2bc = local_2bc + 1) {
          uVar5 = SDL_GetAudioDeviceName(local_2bc,0);
          printf("    - Playback device #%d: \'%s\'\n",(ulong)uVar1,uVar5);
        }
        SDL_memset(&local_2e0,0,0x20);
        local_2e0 = 16000;
        local_2dc = 0x8120;
        local_2da = 1;
        local_2d8 = 0x200;
        local_2d0 = cbPlayback;
        local_2c8 = local_2b0;
        SDL_memset(&local_300,0,0x20);
        uVar1 = local_44;
        uVar5 = SDL_GetAudioDeviceName(local_44,0);
        printf("Attempt to open playback device %d : \'%s\' ...\n",(ulong)uVar1,uVar5);
        uVar5 = SDL_GetAudioDeviceName(local_44,0);
        iVar3 = SDL_OpenAudioDevice(uVar5,0,&local_2e0,&local_300,4);
        if (iVar3 == 0) {
          uVar5 = SDL_GetError();
          SDL_LogError(0,"Couldn\'t open an audio device for playback: %s!\n",uVar5);
          SDL_Quit();
          local_4 = -2;
        }
        else {
          printf("Opened playback device succesfully!\n");
          printf("    Frequency:  %d\n",(ulong)local_300);
          printf("    Format:     %d (%d bytes)\n",(ulong)local_2fc,4);
          printf("    Channels:   %d\n",(ulong)local_2fa);
          printf("    Samples:    %d\n",(ulong)local_2f8);
          SDL_PauseAudioDevice(iVar3,0);
          while ((g_terminate & 1U) == 0) {
            SDL_Delay(100);
          }
          std::ifstream::close();
          SDL_CloseAudio();
          local_4 = 0;
        }
      }
    }
    local_2b4 = 1;
    std::ifstream::~ifstream(local_2b0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x12e22f);
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s input.kbd [-pN]\n", argv[0]);
    printf("    -pN - select playback device N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int playbackId = argm["p"].empty() ? 0 : std::stoi(argm["p"]);

    std::ifstream fin(argv[1], std::ios::binary);
    if (fin.good() == false) {
        fprintf(stderr, "Failed to open file '%s'\n", argv[1]);
        return -1;
    }

    if (SDL_Init(SDL_INIT_AUDIO) < 0) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
        return -1;
    }

    int nDevices = SDL_GetNumAudioDevices(SDL_FALSE);
    printf("Found %d playback devices:\n", nDevices);
    for (int i = 0; i < nDevices; i++) {
        printf("    - Playback device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_FALSE));
    }

    SDL_AudioSpec playbackSpec;
    SDL_zero(playbackSpec);

    playbackSpec.freq = kSampleRate;
    playbackSpec.format = AUDIO_F32SYS;
    playbackSpec.channels = 1;
    playbackSpec.samples = kSamplesPerFrame;
    playbackSpec.callback = cbPlayback;
    playbackSpec.userdata = (void *)(&fin);

    SDL_AudioSpec obtainedSpec;
    SDL_zero(obtainedSpec);

    printf("Attempt to open playback device %d : '%s' ...\n", playbackId, SDL_GetAudioDeviceName(playbackId, SDL_FALSE));
    auto deviceIdOut = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(playbackId, SDL_FALSE), SDL_FALSE, &playbackSpec, &obtainedSpec, SDL_AUDIO_ALLOW_CHANNELS_CHANGE);
    if (!deviceIdOut) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't open an audio device for playback: %s!\n", SDL_GetError());
        SDL_Quit();
        return -2;
    }

    int sampleSize_bytes = 4; // todo

    printf("Opened playback device succesfully!\n");
    printf("    Frequency:  %d\n", obtainedSpec.freq);
    printf("    Format:     %d (%d bytes)\n", obtainedSpec.format, sampleSize_bytes);
    printf("    Channels:   %d\n", obtainedSpec.channels);
    printf("    Samples:    %d\n", obtainedSpec.samples);

    SDL_PauseAudioDevice(deviceIdOut, 0);

    while (g_terminate == false) {
        SDL_Delay(100);
    }

    fin.close();

    SDL_CloseAudio();

    return 0;
}